

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall
tetgenmesh::calculateabovepoint4(tetgenmesh *this,point pa,point pb,point pc,point pd)

{
  point pdVar1;
  double *n;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double n2 [3];
  double n1 [3];
  
  facenormal(this,pa,pb,pc,n1,1,(double *)0x0);
  n = n2;
  facenormal(this,pa,pb,pd,n,1,(double *)0x0);
  auVar3._0_8_ = n1[0] * n1[0] + n1[1] * n1[1];
  auVar3._8_8_ = n2[0] * n2[0] + n2[1] * n2[1];
  auVar4._8_8_ = n2[2] * n2[2] + auVar3._8_8_;
  auVar4._0_8_ = n1[2] * n1[2] + auVar3._0_8_;
  auVar4 = sqrtpd(auVar3,auVar4);
  dVar2 = auVar4._8_8_;
  if (dVar2 < auVar4._0_8_) {
    n = n1;
    dVar2 = auVar4._0_8_;
  }
  *n = *n / dVar2;
  n[1] = n[1] / dVar2;
  n[2] = n[2] / dVar2;
  dVar2 = distance(this,pa,pb);
  pdVar1 = this->dummypoint;
  *pdVar1 = *n * dVar2 + *pa;
  pdVar1[1] = n[1] * dVar2 + pa[1];
  pdVar1[2] = dVar2 * n[2] + pa[2];
  return;
}

Assistant:

void tetgenmesh::calculateabovepoint4(point pa, point pb, point pc, point pd)
{
  REAL n1[3], n2[3], *norm;
  REAL len, len1, len2;

  // Select a base.
  facenormal(pa, pb, pc, n1, 1, NULL);
  len1 = sqrt(dot(n1, n1));
  facenormal(pa, pb, pd, n2, 1, NULL);
  len2 = sqrt(dot(n2, n2));
  if (len1 > len2) {
    norm = n1;
    len = len1;
  } else {
    norm = n2;
    len = len2;
  }
  norm[0] /= len;
  norm[1] /= len;
  norm[2] /= len;
  len = distance(pa, pb);
  dummypoint[0] = pa[0] + len * norm[0];
  dummypoint[1] = pa[1] + len * norm[1];
  dummypoint[2] = pa[2] + len * norm[2];
}